

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O2

void test9(void)

{
  int iVar1;
  ostream *poVar2;
  int (*paiVar3) [32];
  int i;
  long lVar4;
  int i_2;
  Ignore<int_&> local_30;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  for (lVar4 = 0; lVar4 < nsize; lVar4 = lVar4 + 1) {
    depspawn::spawn<void(int,int&),int&,int&>(depprev,&nthreads,*paiVar3);
    paiVar3 = paiVar3 + 1;
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  iVar1 = nsize;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    if ((*paiVar3)[0] != nthreads + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar4);
      poVar2 = std::operator<<(poVar2," -> ");
      std::ostream::operator<<(poVar2,(*paiVar3)[0]);
      doerror();
      iVar1 = nsize;
    }
    (*paiVar3)[0] = 0;
    paiVar3 = paiVar3 + 1;
  }
  pr("f(const_var, diff_int&)");
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  for (lVar4 = 0; lVar4 < nsize; lVar4 = lVar4 + 1) {
    depspawn::spawn<void(int,int&),int,int&>(depprev,&nthreads,*paiVar3);
    paiVar3 = paiVar3 + 1;
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  iVar1 = nsize;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    if ((*paiVar3)[0] != nthreads + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar4);
      poVar2 = std::operator<<(poVar2," -> ");
      std::ostream::operator<<(poVar2,(*paiVar3)[0]);
      doerror();
      iVar1 = nsize;
    }
    (*paiVar3)[0] = 0;
    paiVar3 = paiVar3 + 1;
  }
  pr("f(frozen const_var, diff_int&)");
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  for (lVar4 = 0; lVar4 < nsize; lVar4 = lVar4 + 1) {
    local_30.t_ = &nthreads;
    depspawn::spawn<void(int,int&),depspawn::Ignore<int&>,int&>(depprev,&local_30,*paiVar3);
    paiVar3 = paiVar3 + 1;
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar3 = mx;
  iVar1 = nsize;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    if ((*paiVar3)[0] != nthreads + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)lVar4);
      poVar2 = std::operator<<(poVar2," -> ");
      std::ostream::operator<<(poVar2,(*paiVar3)[0]);
      doerror();
      iVar1 = nsize;
    }
    (*paiVar3)[0] = 0;
    paiVar3 = paiVar3 + 1;
  }
  pr("f(ignore(const_var), diff_int&)");
  return;
}

Assistant:

void test9()
{
  
  //V1: just use it "as is"
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, nthreads, mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(const_var, diff_int&)");
  
  //V2: Freeze it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, std::move(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(frozen const_var, diff_int&)");
  
  //V3: Ignore it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, ignore(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(ignore(const_var), diff_int&)");
}